

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

double HeadingDiff(double head1,double head2)

{
  uint uVar1;
  LTError *this;
  int in_EDI;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  double local_18;
  double local_10;
  double local_8;
  
  uVar1 = std::isnan(in_XMM0_Qa);
  if (((uVar1 & 1) == 0) && (uVar1 = std::isnan(in_XMM1_Qa), (uVar1 & 1) == 0)) {
    std::abs(in_EDI);
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    if (180.0 < extraout_XMM0_Qa) {
      if (in_XMM1_Qa <= in_XMM0_Qa) {
        local_18 = in_XMM1_Qa + 360.0;
      }
      else {
        local_10 = in_XMM0_Qa + 360.0;
      }
      std::abs(in_EDI);
      if (180.0 < extraout_XMM0_Qa_00) {
        this = (LTError *)__cxa_allocate_exception(0x18);
        LTError::LTError(this,
                         "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                         ,0x283,"HeadingDiff",logFATAL,"ASSERT FAILED: %s",
                         "std::abs(head2-head1) <= 180");
        __cxa_throw(this,&LTError::typeinfo,LTError::~LTError);
      }
    }
    local_8 = local_18 - local_10;
  }
  else {
    local_8 = NAN;
  }
  return local_8;
}

Assistant:

double HeadingDiff (double head1, double head2)
{
    // if either value is nan return nan
    if (std::isnan(head1) || std::isnan(head2)) return NAN;
    
    // if 0° North lies between head1 and head2 then simple
    // diff doesn't work
    if ( std::abs(head2-head1) > 180 ) {
        // add 360° to the lesser value...then diff works
        if ( head1 < head2 )
            head1 += 360;
        else
            head2 += 360;
        LOG_ASSERT ( std::abs(head2-head1) <= 180 );
    }
    
    return head2 - head1;
}